

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_tec_twod_zone(REF_GRID ref_grid,FILE *file)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_STATUS local_ec;
  REF_STATUS local_e8;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT boundary_index;
  REF_INT boundary_tag;
  REF_DICT ref_dict;
  REF_INT nnode;
  REF_INT cell;
  REF_INT nodes [27];
  REF_INT nface;
  REF_INT *l2g;
  REF_INT *g2l;
  REF_CELL pRStack_30;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  ref_node = (REF_NODE)file;
  file_local = (FILE *)ref_grid;
  uVar1 = ref_dict_create((REF_DICT *)&boundary_index);
  if (uVar1 == 0) {
    pRStack_30 = (REF_CELL)file_local->_IO_write_ptr;
    for (ref_dict._4_4_ = 0; ref_dict._4_4_ < pRStack_30->max; ref_dict._4_4_ = ref_dict._4_4_ + 1)
    {
      RVar2 = ref_cell_nodes(pRStack_30,ref_dict._4_4_,&nnode);
      if ((RVar2 == 0) &&
         (uVar1 = ref_dict_store(_boundary_index,(&nnode)[pRStack_30->node_per],-1), uVar1 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x268,"ref_export_tec_twod_zone",(ulong)uVar1,"mark tri");
        return uVar1;
      }
    }
    pRStack_30 = (REF_CELL)file_local->_IO_buf_end;
    for (ref_dict._4_4_ = 0; ref_dict._4_4_ < pRStack_30->max; ref_dict._4_4_ = ref_dict._4_4_ + 1)
    {
      RVar2 = ref_cell_nodes(pRStack_30,ref_dict._4_4_,&nnode);
      if ((RVar2 == 0) &&
         (uVar1 = ref_dict_store(_boundary_index,(&nnode)[pRStack_30->node_per],-1), uVar1 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x26d,"ref_export_tec_twod_zone",(ulong)uVar1,"mark qua");
        return uVar1;
      }
    }
    ref_private_macro_code_rss_1 = 0;
    if (_boundary_index->n < 1) {
      local_e8 = -1;
    }
    else {
      local_e8 = *_boundary_index->key;
    }
    ref_private_macro_code_rss = local_e8;
    while (ref_private_macro_code_rss_1 < _boundary_index->n) {
      uVar1 = ref_grid_tri_qua_id_nodes
                        ((REF_GRID)file_local,ref_private_macro_code_rss,(REF_INT *)&ref_dict,
                         nodes + 0x19,&l2g,(REF_INT **)(nodes + 0x1a));
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x272,"ref_export_tec_twod_zone",(ulong)uVar1,"extract this boundary");
        return uVar1;
      }
      fprintf((FILE *)ref_node,
              "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              (ulong)(uint)ref_private_macro_code_rss,(ulong)(uint)ref_dict,(ulong)(uint)nodes[0x19]
              ,"point","fequadrilateral");
      for (g2l._4_4_ = 0; g2l._4_4_ < (int)(uint)ref_dict; g2l._4_4_ = g2l._4_4_ + 1) {
        fprintf((FILE *)ref_node," %.16e %.16e\n",
                *(undefined8 *)
                 (ref_cell->c2n +
                 (long)(*(int *)((long)stack0xffffffffffffffb8 + (long)g2l._4_4_ * 4) * 0xf) * 2),
                *(undefined8 *)
                 (ref_cell->c2n +
                 (long)(*(int *)((long)stack0xffffffffffffffb8 + (long)g2l._4_4_ * 4) * 0xf + 1) * 2
                 ));
      }
      pRStack_30 = (REF_CELL)file_local->_IO_write_ptr;
      for (ref_dict._4_4_ = 0; ref_dict._4_4_ < pRStack_30->max; ref_dict._4_4_ = ref_dict._4_4_ + 1
          ) {
        RVar2 = ref_cell_nodes(pRStack_30,ref_dict._4_4_,&nnode);
        if ((RVar2 == 0) && (ref_private_macro_code_rss == (&nnode)[pRStack_30->node_per])) {
          nodes[1] = nodes[0];
          for (g2l._4_4_ = 0; g2l._4_4_ < 4; g2l._4_4_ = g2l._4_4_ + 1) {
            fprintf((FILE *)ref_node," %d",(ulong)(l2g[(&nnode)[g2l._4_4_]] + 1));
          }
          fprintf((FILE *)ref_node,"\n");
        }
      }
      pRStack_30 = (REF_CELL)file_local->_IO_buf_end;
      for (ref_dict._4_4_ = 0; ref_dict._4_4_ < pRStack_30->max; ref_dict._4_4_ = ref_dict._4_4_ + 1
          ) {
        RVar2 = ref_cell_nodes(pRStack_30,ref_dict._4_4_,&nnode);
        if ((RVar2 == 0) && (ref_private_macro_code_rss == (&nnode)[pRStack_30->node_per])) {
          for (g2l._4_4_ = 0; g2l._4_4_ < 4; g2l._4_4_ = g2l._4_4_ + 1) {
            fprintf((FILE *)ref_node," %d",(ulong)(l2g[(&nnode)[g2l._4_4_]] + 1));
          }
          fprintf((FILE *)ref_node,"\n");
        }
      }
      if (stack0xffffffffffffffb8 != (void *)0x0) {
        free(stack0xffffffffffffffb8);
      }
      if (l2g != (REF_INT *)0x0) {
        free(l2g);
      }
      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
      if ((ref_private_macro_code_rss_1 < 0) || (_boundary_index->n <= ref_private_macro_code_rss_1)
         ) {
        local_ec = -1;
      }
      else {
        local_ec = _boundary_index->key[ref_private_macro_code_rss_1];
      }
      ref_private_macro_code_rss = local_ec;
    }
    ref_grid_local._4_4_ = ref_dict_free(_boundary_index);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x295,"ref_export_tec_twod_zone",(ulong)ref_grid_local._4_4_,"free dict");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x263,
           "ref_export_tec_twod_zone",(ulong)uVar1,"create dict");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_tec_twod_zone(REF_GRID ref_grid,
                                                   FILE *file) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *g2l, *l2g;
  REF_INT nface;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnode;
  REF_DICT ref_dict;
  REF_INT boundary_tag, boundary_index;

  ref_node = ref_grid_node(ref_grid);

  RSS(ref_dict_create(&ref_dict), "create dict");

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) RSS(
      ref_dict_store(ref_dict, nodes[ref_cell_id_index(ref_cell)], REF_EMPTY),
      "mark tri");

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) RSS(
      ref_dict_store(ref_dict, nodes[ref_cell_id_index(ref_cell)], REF_EMPTY),
      "mark qua");

  each_ref_dict_key(ref_dict, boundary_index, boundary_tag) {
    RSS(ref_grid_tri_qua_id_nodes(ref_grid, boundary_tag, &nnode, &nface, &g2l,
                                  &l2g),
        "extract this boundary");

    fprintf(file,
            "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            boundary_tag, nnode, nface, "point", "fequadrilateral");

    for (node = 0; node < nnode; node++)
      fprintf(file, " %.16e %.16e\n", ref_node_xyz(ref_node, 0, l2g[node]),
              ref_node_xyz(ref_node, 1, l2g[node]));

    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (boundary_tag == nodes[ref_cell_id_index(ref_cell)]) {
        nodes[3] = nodes[2];
        for (node = 0; node < 4; node++) {
          fprintf(file, " %d", g2l[nodes[node]] + 1);
        }
        fprintf(file, "\n");
      }
    }

    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (boundary_tag == nodes[ref_cell_id_index(ref_cell)]) {
        for (node = 0; node < 4; node++)
          fprintf(file, " %d", g2l[nodes[node]] + 1);
        fprintf(file, "\n");
      }
    }

    ref_free(l2g);
    ref_free(g2l);
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}